

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.cxx
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_*,_std::vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>_>,_bool>
 __thiscall
ArgumentParser::PositionActionMap::Emplace
          (PositionActionMap *this,size_t pos,PositionAction *action)

{
  pointer ppVar1;
  ulong uVar2;
  iterator __position;
  ulong uVar3;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  pair<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_*,_std::vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>_>,_bool>
  pVar5;
  size_t pos_local;
  
  __position._M_current =
       (this->
       super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
       ).
       super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->
           super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
           ).
           super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = ((long)ppVar1 - (long)__position._M_current) / 0x28;
  while (uVar2 = uVar3, 0 < (long)uVar2) {
    uVar3 = uVar2 >> 1;
    if (__position._M_current[uVar3].first < pos) {
      __position._M_current = __position._M_current + uVar3 + 1;
      uVar3 = ~uVar3 + uVar2;
    }
  }
  if ((__position._M_current == ppVar1) || ((__position._M_current)->first != pos)) {
    pos_local = pos;
    __position = std::
                 vector<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>,std::allocator<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>>>
                 ::
                 _M_emplace_aux<unsigned_long&,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>
                           ((vector<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>,std::allocator<std::pair<unsigned_long,std::function<void(ArgumentParser::Instance&,unsigned_long,std::basic_string_view<char,std::char_traits<char>>)>>>>
                             *)this,__position._M_current,&pos_local,action);
    uVar4 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  }
  else {
    uVar4 = 0;
  }
  pVar5._8_8_ = uVar4;
  pVar5.first._M_current = __position._M_current;
  return pVar5;
}

Assistant:

auto PositionActionMap::Emplace(std::size_t pos, PositionAction action)
  -> std::pair<iterator, bool>
{
  auto const it = std::lower_bound(
    this->begin(), this->end(), pos,
    [](value_type const& elem, std::size_t k) { return elem.first < k; });
  return (it != this->end() && it->first == pos)
    ? std::make_pair(it, false)
    : std::make_pair(this->emplace(it, pos, std::move(action)), true);
}